

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::SourceWrapper<absl::lts_20250127::Cord>::MergeInto<false>
          (SourceWrapper<absl::lts_20250127::Cord> *this,MessageLite *msg,TcParseTableBase *tc_table
          ,ParseFlags parse_flags)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  size_type sVar3;
  ParseFlags in_R9D;
  string_view input_00;
  undefined1 local_120 [8];
  CordInputStream input;
  undefined1 local_48 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> flat;
  ParseFlags parse_flags_local;
  TcParseTableBase *tc_table_local;
  MessageLite *msg_local;
  SourceWrapper<absl::lts_20250127::Cord> *this_local;
  
  flat.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _20_4_ = parse_flags;
  absl::lts_20250127::Cord::TryFlat
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_48,this->cord
            );
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_48);
  if (bVar1) {
    pbVar2 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator->
                       ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_48
                       );
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar2);
    if (sVar3 < 0x201) {
      pbVar2 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                         ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          local_48);
      input.available_ = pbVar2->_M_len;
      input_00._M_str = (char *)msg;
      input_00._M_len = (size_t)pbVar2->_M_str;
      bVar1 = MergeFromImpl<false>
                        ((internal *)input.available_,input_00,(MessageLite *)tc_table,
                         (TcParseTableBase *)
                         (ulong)(uint)flat.
                                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                      ._M_payload.
                                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                      ._20_4_,in_R9D);
      return bVar1;
    }
  }
  io::CordInputStream::CordInputStream((CordInputStream *)local_120,this->cord);
  bVar1 = MergeFromImpl<false>
                    ((ZeroCopyInputStream *)local_120,msg,tc_table,
                     flat.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._20_4_);
  io::CordInputStream::~CordInputStream((CordInputStream *)local_120);
  return bVar1;
}

Assistant:

bool MergeInto(MessageLite* msg, const internal::TcParseTableBase* tc_table,
                 MessageLite::ParseFlags parse_flags) const {
    absl::optional<absl::string_view> flat = cord->TryFlat();
    if (flat && flat->size() <= ParseContext::kMaxCordBytesToCopy) {
      return MergeFromImpl<alias>(*flat, msg, tc_table, parse_flags);
    } else {
      io::CordInputStream input(cord);
      return MergeFromImpl<alias>(&input, msg, tc_table, parse_flags);
    }
  }